

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_mull(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  uint16_t uVar1;
  int iVar2;
  TCGv_i32 pTVar3;
  int sign;
  TCGv_i32 src1;
  uint16_t ext;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  if ((uVar1 & 0x400) == 0) {
    pTVar3 = gen_ea(env,s,insn,2,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                    (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar3 == tcg_ctx_00->NULL_QREG) {
      gen_addr_fault(s);
    }
    else {
      iVar2 = m68k_feature(s->env,0);
      if (iVar2 == 0) {
        tcg_gen_mul_i32(tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)],pTVar3,
                        tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)]);
        gen_logic_cc(s,tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)],2);
      }
      else {
        tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_C,0);
        if ((uVar1 & 0x800) == 0) {
          tcg_gen_mulu2_i32_m68k
                    (tcg_ctx_00,QREG_CC_N,QREG_CC_V,pTVar3,
                     tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)]);
          tcg_gen_setcond_i32_m68k(tcg_ctx_00,TCG_COND_NE,QREG_CC_V,QREG_CC_V,QREG_CC_C);
        }
        else {
          tcg_gen_muls2_i32_m68k
                    (tcg_ctx_00,QREG_CC_N,QREG_CC_V,pTVar3,
                     tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)]);
          tcg_gen_sari_i32_m68k(tcg_ctx_00,QREG_CC_Z,QREG_CC_N,0x1f);
          tcg_gen_setcond_i32_m68k(tcg_ctx_00,TCG_COND_NE,QREG_CC_V,QREG_CC_V,QREG_CC_Z);
        }
        tcg_gen_neg_i32(tcg_ctx_00,QREG_CC_V,QREG_CC_V);
        tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)],
                        QREG_CC_N);
        tcg_gen_mov_i32(tcg_ctx_00,QREG_CC_Z,QREG_CC_N);
        set_cc_op(s,CC_OP_FLAGS);
      }
    }
  }
  else {
    iVar2 = m68k_feature(s->env,0x12);
    if (iVar2 == 0) {
      gen_exception(s,(s->base).pc_next,4);
    }
    else {
      pTVar3 = gen_ea(env,s,insn,2,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                      (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
      if (pTVar3 == tcg_ctx_00->NULL_QREG) {
        gen_addr_fault(s);
      }
      else {
        if ((uVar1 & 0x800) == 0) {
          tcg_gen_mulu2_i32_m68k
                    (tcg_ctx_00,QREG_CC_Z,QREG_CC_N,pTVar3,
                     tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)]);
        }
        else {
          tcg_gen_muls2_i32_m68k
                    (tcg_ctx_00,QREG_CC_Z,QREG_CC_N,pTVar3,
                     tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)]);
        }
        tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)(uVar1 & 7)],QREG_CC_N);
        tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)],
                        QREG_CC_Z);
        tcg_gen_or_i32(tcg_ctx_00,QREG_CC_Z,QREG_CC_Z,QREG_CC_N);
        tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_V,0);
        tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_C,0);
        set_cc_op(s,CC_OP_FLAGS);
      }
    }
  }
  return;
}

Assistant:

DISAS_INSN(mull)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext;
    TCGv src1;
    int sign;

    ext = read_im16(env, s);

    sign = ext & 0x800;

    if (ext & 0x400) {
        if (!m68k_feature(s->env, M68K_FEATURE_QUAD_MULDIV)) {
            gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
            return;
        }

        SRC_EA(env, src1, OS_LONG, 0, NULL);

        if (sign) {
            tcg_gen_muls2_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, src1, DREG(ext, 12));
        } else {
            tcg_gen_mulu2_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, src1, DREG(ext, 12));
        }
        /* if Dl == Dh, 68040 returns low word */
        tcg_gen_mov_i32(tcg_ctx, DREG(ext, 0), QREG_CC_N);
        tcg_gen_mov_i32(tcg_ctx, DREG(ext, 12), QREG_CC_Z);
        tcg_gen_or_i32(tcg_ctx, QREG_CC_Z, QREG_CC_Z, QREG_CC_N);

        tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, 0);

        set_cc_op(s, CC_OP_FLAGS);
        return;
    }
    SRC_EA(env, src1, OS_LONG, 0, NULL);
    if (m68k_feature(s->env, M68K_FEATURE_M68000)) {
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, 0);
        if (sign) {
            tcg_gen_muls2_i32(tcg_ctx, QREG_CC_N, QREG_CC_V, src1, DREG(ext, 12));
            /* QREG_CC_V is -(QREG_CC_V != (QREG_CC_N >> 31)) */
            tcg_gen_sari_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, 31);
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, QREG_CC_V, QREG_CC_Z);
        } else {
            tcg_gen_mulu2_i32(tcg_ctx, QREG_CC_N, QREG_CC_V, src1, DREG(ext, 12));
            /* QREG_CC_V is -(QREG_CC_V != 0), use QREG_CC_C as 0 */
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_NE, QREG_CC_V, QREG_CC_V, QREG_CC_C);
        }
        tcg_gen_neg_i32(tcg_ctx, QREG_CC_V, QREG_CC_V);
        tcg_gen_mov_i32(tcg_ctx, DREG(ext, 12), QREG_CC_N);

        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);

        set_cc_op(s, CC_OP_FLAGS);
    } else {
        /*
         * The upper 32 bits of the product are discarded, so
         * muls.l and mulu.l are functionally equivalent.
         */
        tcg_gen_mul_i32(tcg_ctx, DREG(ext, 12), src1, DREG(ext, 12));
        gen_logic_cc(s, DREG(ext, 12), OS_LONG);
    }
}